

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiSapBroadphase.cpp
# Opt level: O0

bool __thiscall
btMultiSapBroadphasePairSortPredicate::operator()
          (btMultiSapBroadphasePairSortPredicate *this,btBroadphasePair *a1,btBroadphasePair *b1)

{
  bool local_5a;
  bool local_59;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  btMultiSapProxy *bProxy1;
  btMultiSapProxy *bProxy0;
  btMultiSapProxy *aProxy1;
  btMultiSapProxy *aProxy0;
  btBroadphasePair *b1_local;
  btBroadphasePair *a1_local;
  btMultiSapBroadphasePairSortPredicate *this_local;
  
  if (a1->m_pProxy0 == (btBroadphaseProxy *)0x0) {
    local_40 = (void *)0x0;
  }
  else {
    local_40 = a1->m_pProxy0->m_multiSapParentProxy;
  }
  if (a1->m_pProxy1 == (btBroadphaseProxy *)0x0) {
    local_48 = (void *)0x0;
  }
  else {
    local_48 = a1->m_pProxy1->m_multiSapParentProxy;
  }
  if (b1->m_pProxy0 == (btBroadphaseProxy *)0x0) {
    local_50 = (void *)0x0;
  }
  else {
    local_50 = b1->m_pProxy0->m_multiSapParentProxy;
  }
  if (b1->m_pProxy1 == (btBroadphaseProxy *)0x0) {
    local_58 = (void *)0x0;
  }
  else {
    local_58 = b1->m_pProxy1->m_multiSapParentProxy;
  }
  local_59 = true;
  if ((local_40 <= local_50) && ((local_40 != local_50 || (local_59 = true, local_48 <= local_58))))
  {
    local_5a = false;
    if ((local_40 == local_50) && (local_5a = false, local_48 == local_58)) {
      local_5a = b1->m_algorithm < a1->m_algorithm;
    }
    local_59 = local_5a;
  }
  return local_59;
}

Assistant:

bool operator() ( const btBroadphasePair& a1, const btBroadphasePair& b1 ) const
		{
				btMultiSapBroadphase::btMultiSapProxy* aProxy0 = a1.m_pProxy0 ? (btMultiSapBroadphase::btMultiSapProxy*)a1.m_pProxy0->m_multiSapParentProxy : 0;
				btMultiSapBroadphase::btMultiSapProxy* aProxy1 = a1.m_pProxy1 ? (btMultiSapBroadphase::btMultiSapProxy*)a1.m_pProxy1->m_multiSapParentProxy : 0;
				btMultiSapBroadphase::btMultiSapProxy* bProxy0 = b1.m_pProxy0 ? (btMultiSapBroadphase::btMultiSapProxy*)b1.m_pProxy0->m_multiSapParentProxy : 0;
				btMultiSapBroadphase::btMultiSapProxy* bProxy1 = b1.m_pProxy1 ? (btMultiSapBroadphase::btMultiSapProxy*)b1.m_pProxy1->m_multiSapParentProxy : 0;

				 return aProxy0 > bProxy0 || 
					(aProxy0 == bProxy0 && aProxy1 > bProxy1) ||
					(aProxy0 == bProxy0 && aProxy1 == bProxy1 && a1.m_algorithm > b1.m_algorithm); 
		}